

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O1

void __thiscall
slang::ast::InsideExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (InsideExpression *this,SampledValueExprVisitor *visitor)

{
  size_type sVar1;
  pointer ppEVar2;
  Expression *this_00;
  long lVar3;
  
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this->left_,this->left_,visitor);
  sVar1 = (this->rangeList_).size_;
  if (sVar1 != 0) {
    ppEVar2 = (this->rangeList_).data_;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar2 + lVar3);
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
                (this_00,this_00,visitor);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto range : rangeList())
            range->visit(visitor);
    }